

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O2

state_status_t
tchecker::ta::final(system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,vedge_sptr_t *vedge,
                   sync_id_t *sync_id,clock_constraint_container_t *invariant,
                   final_value_t *final_value)

{
  int iVar1;
  uint uVar2;
  integer_iterator_t<int> *piVar3;
  state_status_t sVar4;
  integer_t iVar5;
  size_t sVar6;
  make_array_t<int,_4UL,_tchecker::intval_base_t> *this;
  int *piVar7;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar8;
  bytecode_t *bytecode;
  intval_t *intval_00;
  runtime_error *this_00;
  iterator iVar9;
  int iVar10;
  long lVar11;
  
  sVar4 = syncprod::final(&system->super_system_t,vloc,vedge,sync_id,
                          &(final_value->
                           super__Tuple_impl<0UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
                           ).
                           super__Head_base<0UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_false>
                           ._M_head_impl);
  if (sVar4 == 1) {
    sVar6 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::size((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&(system->super_system_t).super_system_t.super_intvars_t._integer_variables.
                       super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._flattened_variables);
    piVar3 = (final_value->
             super__Tuple_impl<0UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
             ).
             super__Tuple_impl<1UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
             .
             super__Head_base<1UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>,_false>
             ._M_head_impl._end._it._M_current;
    iVar10 = 0;
    for (iVar9._M_current =
              (final_value->
              super__Tuple_impl<0UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
              ).
              super__Tuple_impl<1UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
              .
              super__Head_base<1UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>,_false>
              ._M_head_impl._begin._it._M_current; iVar9._M_current != piVar3;
        iVar9._M_current = iVar9._M_current + 1) {
      if ((int)sVar6 == iVar10) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"tchecker::ta::final: valuation of incompatible size");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = (iVar9._M_current)->_current;
      this = (make_array_t<int,_4UL,_tchecker::intval_base_t> *)
             intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
             ::operator*(intval);
      piVar7 = make_array_t<int,_4UL,_tchecker::intval_base_t>::operator[]
                         (this,(capacity_t_conflict)iVar10);
      *piVar7 = iVar1;
      iVar10 = iVar10 + 1;
    }
    pmVar8 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
             ::operator*(vloc);
    uVar2 = (pmVar8->super_vloc_t).super_loc_array_t.super_vloc_base_t.
            super_array_capacity_t<unsigned_int>._capacity;
    lVar11 = 0;
    while( true ) {
      if ((ulong)uVar2 << 2 == lVar11) {
        return 1;
      }
      bytecode = system_t::invariant_bytecode
                           (system,*(loc_id_t *)
                                    (&(pmVar8->super_vloc_t).super_loc_array_t._fam.field_0x0 +
                                    lVar11));
      intval_00 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
                   ::operator*(intval)->super_intval_t;
      iVar5 = vm_t::run(&system->_vm,bytecode,intval_00,invariant,
                        (clock_reset_container_t *)&place_holder_clkreset);
      if (iVar5 == 0) break;
      lVar11 = lVar11 + 4;
      if (place_holder_clkreset != DAT_002306e0) {
        __assert_fail("place_holder_clkreset.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/ta.cc"
                      ,0x56,
                      "tchecker::state_status_t tchecker::ta::final(const tchecker::ta::system_t &, const tchecker::vloc_sptr_t &, const tchecker::intval_sptr_t &, const tchecker::vedge_sptr_t &, tchecker::sync_id_t &, tchecker::clock_constraint_container_t &, const tchecker::ta::final_value_t &)"
                     );
      }
    }
    sVar4 = 0x10;
  }
  return sVar4;
}

Assistant:

tchecker::state_status_t final(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                               tchecker::intval_sptr_t const & intval, tchecker::vedge_sptr_t const & vedge,
                               tchecker::sync_id_t & sync_id, tchecker::clock_constraint_container_t & invariant,
                               tchecker::ta::final_value_t const & final_value)
{
  auto && [edges, valuation] = final_value;

  // compute vloc and vedge from final edges
  auto status = tchecker::syncprod::final(system.as_syncprod_system(), vloc, vedge, sync_id, edges);
  if (status != STATE_OK)
    return status;

  // compute intval
  auto const & intvars = system.integer_variables().flattened();
  tchecker::intvar_id_t intvars_size = intvars.size();
  tchecker::intvar_id_t id = 0;
  for (tchecker::integer_t v : valuation) {
    if (id >= intvars_size)
      throw std::runtime_error("tchecker::ta::final: valuation of incompatible size");
    (*intval)[id] = v;
    ++id;
  }

  // check invariant
  tchecker::vm_t & vm = system.vm();
  for (tchecker::loc_id_t loc_id : *vloc) {
    if (vm.run(system.invariant_bytecode(loc_id), *intval, invariant, place_holder_clkreset) == 0)
      return tchecker::STATE_INTVARS_TGT_INVARIANT_VIOLATED;
    assert(place_holder_clkreset.empty());
  }

  return tchecker::STATE_OK;
}